

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmTst<(moira::Instr)128,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Av<(moira::Instr)128,_(moira::Mode)9,_4> local_44;
  int local_40;
  undefined1 local_38 [8];
  Ea<(moira::Mode)9,_4> ea;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  ea.ext2._2_2_ = op;
  unique0x100000b0 = addr;
  Op<(moira::Mode)9,4>((Ea<(moira::Mode)9,_4> *)local_38,this,op & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  local_40 = (str->tab).raw;
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_40);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)9,_4> *)local_38);
  local_44.ext1 = 0;
  StrWriter::operator<<(str,&local_44);
  return;
}

Assistant:

void
Moira::dasmTst(StrWriter &str, u32 &addr, u16 op) const
{
    auto ea = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << ea;
    str << Av<I, M, S>{};
}